

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_traverse_tree(archive_write *a,vdd *vdd)

{
  iso9660_conflict *iso9660_00;
  wchar_t wVar1;
  code *local_f0;
  _func_int_archive_write_ptr_isoent_ptr_idr_ptr *genid;
  int r;
  int depth;
  idr idr;
  isoent *np;
  iso9660_conflict *iso9660;
  vdd *vdd_local;
  archive_write *a_local;
  
  iso9660_00 = (iso9660_conflict *)a->format_data;
  idr_init(iso9660_00,vdd,(idr *)&r);
  idr.char_map._120_8_ = vdd->rootent;
  genid._4_4_ = 0;
  if (vdd->vdd_type == VDD_JOLIET) {
    local_f0 = isoent_gen_joliet_identifier;
  }
  else {
    local_f0 = isoent_gen_iso9660_identifier;
  }
  do {
    if (((char)(*(char *)(idr.char_map._120_8_ + 0xe8) << 7) < '\0') &&
       (wVar1 = archive_entry_mtime_is_set
                          (*(archive_entry **)(*(long *)(idr.char_map._120_8_ + 0x18) + 0x20)),
       wVar1 == L'\0')) {
      archive_entry_set_mtime
                (*(archive_entry **)(*(long *)(idr.char_map._120_8_ + 0x18) + 0x20),
                 iso9660_00->birth_time,0);
      archive_entry_set_atime
                (*(archive_entry **)(*(long *)(idr.char_map._120_8_ + 0x18) + 0x20),
                 iso9660_00->birth_time,0);
      archive_entry_set_ctime
                (*(archive_entry **)(*(long *)(idr.char_map._120_8_ + 0x18) + 0x20),
                 iso9660_00->birth_time,0);
    }
    if (*(long *)(idr.char_map._120_8_ + 0x28) == 0) {
LAB_0074c5c9:
      for (; idr.char_map._120_8_ != *(long *)(idr.char_map._120_8_ + 0x20);
          idr.char_map._120_8_ = *(undefined8 *)(idr.char_map._120_8_ + 0x20)) {
        if (*(long *)(idr.char_map._120_8_ + 0x78) != 0) {
          idr.char_map._120_8_ = *(undefined8 *)(idr.char_map._120_8_ + 0x78);
          break;
        }
        genid._4_4_ = genid._4_4_ + -1;
      }
    }
    else {
      if (((vdd->vdd_type != VDD_JOLIET) && (((uint)iso9660_00->opt >> 0x17 & 3) == 0)) &&
         (vdd->max_depth <= genid._4_4_ + 1)) {
        if (0 < *(int *)(idr.char_map._120_8_ + 0x38)) {
          iso9660_00->directories_too_deep = (isoent *)idr.char_map._120_8_;
        }
        goto LAB_0074c5c9;
      }
      genid._0_4_ = (*local_f0)(a,idr.char_map._120_8_,&r);
      if (((int)genid < 0) ||
         (genid._0_4_ = isoent_make_sorted_files(a,(isoent *)idr.char_map._120_8_,(idr *)&r),
         (int)genid < 0)) goto LAB_0074c62d;
      if ((*(long *)(idr.char_map._120_8_ + 0x50) == 0) || (vdd->max_depth <= genid._4_4_ + 1))
      goto LAB_0074c5c9;
      idr.char_map._120_8_ = *(undefined8 *)(idr.char_map._120_8_ + 0x50);
      genid._4_4_ = genid._4_4_ + 1;
    }
  } while (idr.char_map._120_8_ != *(long *)(idr.char_map._120_8_ + 0x20));
  genid._0_4_ = 0;
LAB_0074c62d:
  idr_cleanup((idr *)&r);
  return (int)genid;
}

Assistant:

static int
isoent_traverse_tree(struct archive_write *a, struct vdd* vdd)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isoent *np;
	struct idr idr;
	int depth;
	int r;
	int (*genid)(struct archive_write *, struct isoent *, struct idr *);

	idr_init(iso9660, vdd, &idr);
	np = vdd->rootent;
	depth = 0;
	if (vdd->vdd_type == VDD_JOLIET)
		genid = isoent_gen_joliet_identifier;
	else
		genid = isoent_gen_iso9660_identifier;
	do {
		if (np->virtual &&
		    !archive_entry_mtime_is_set(np->file->entry)) {
			/* Set properly times to virtual directory */
			archive_entry_set_mtime(np->file->entry,
			    iso9660->birth_time, 0);
			archive_entry_set_atime(np->file->entry,
			    iso9660->birth_time, 0);
			archive_entry_set_ctime(np->file->entry,
			    iso9660->birth_time, 0);
		}
		if (np->children.first != NULL) {
			if (vdd->vdd_type != VDD_JOLIET &&
			    !iso9660->opt.rr && depth + 1 >= vdd->max_depth) {
				if (np->children.cnt > 0)
					iso9660->directories_too_deep = np;
			} else {
				/* Generate Identifier */
				r = genid(a, np, &idr);
				if (r < 0)
					goto exit_traverse_tree;
				r = isoent_make_sorted_files(a, np, &idr);
				if (r < 0)
					goto exit_traverse_tree;

				if (np->subdirs.first != NULL &&
				    depth + 1 < vdd->max_depth) {
					/* Enter to sub directories. */
					np = np->subdirs.first;
					depth++;
					continue;
				}
			}
		}
		while (np != np->parent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != np->parent);

	r = ARCHIVE_OK;
exit_traverse_tree:
	idr_cleanup(&idr);

	return (r);
}